

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O2

int __thiscall sisl::utility::ply_mesh::add_vertex(ply_mesh *this,vertex3 *p)

{
  int iVar1;
  
  std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::push_back(&this->verts,p);
  iVar1 = this->m_currentIndex;
  this->m_currentIndex = iVar1 + 1;
  return iVar1;
}

Assistant:

int add_vertex(const vertex3 &p) {
            using namespace std;
            int r = 0;

            // If we couldn't find a vert like ours,
            // Add it to the list
            #pragma omp critical (add_vertex_)
            {
                verts.push_back(p);
                r = (m_currentIndex++);
            }

            return r;
        }